

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::TextureUploadCase::TextureUploadCase
          (TextureUploadCase *this,Context *context,char *name,char *description,
          UploadFunction uploadFunction,deUint32 format,deUint32 type,int texSize)

{
  deUint32 seed;
  
  gles2::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureUploadCase_01e24ba0;
  this->m_uploadFunction = uploadFunction;
  this->m_format = format;
  this->m_type = type;
  this->m_texSize = texSize;
  this->m_alignment = 4;
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator(&this->m_calibrator);
  this->m_program = (ShaderProgram *)0x0;
  this->m_texture = 0;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  this->m_log = context->m_testCtx->m_log;
  (this->m_texData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_texData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TextureUploadCase::TextureUploadCase (Context& context, const char* name, const char* description, UploadFunction uploadFunction, deUint32 format, deUint32 type, int texSize)
	: TestCase			(context, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_uploadFunction	(uploadFunction)
	, m_format			(format)
	, m_type			(type)
	, m_texSize			(texSize)
	, m_alignment		(4)
	, m_calibrator		()
	, m_program			(DE_NULL)
	, m_texture			(0)
	, m_rnd				(deStringHash(name))
	, m_log				(context.getTestContext().getLog())
{
}